

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  ushort uVar1;
  int iVar2;
  Column *pCVar3;
  sqlite3 *db;
  ExprList *pEVar4;
  Op *pOVar5;
  Expr *pExpr;
  ValueNewStat4Ctx *in_R9;
  long in_FS_OFFSET;
  sqlite3_value *pValue;
  sqlite3_value *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = pTab->aCol;
  uVar1 = pCVar3[i].iDflt;
  if (uVar1 != 0) {
    local_30 = (Mem *)0x0;
    if (((pTab->eTabType == '\0') && (pEVar4 = (pTab->u).tab.pDfltList, pEVar4 != (ExprList *)0x0))
       && ((int)(uint)uVar1 <= pEVar4->nExpr)) {
      pExpr = pEVar4->a[uVar1 - 1].pExpr;
    }
    else {
      pExpr = (Expr *)0x0;
    }
    if (pExpr != (Expr *)0x0) {
      valueFromExpr(v->db,pExpr,v->db->enc,pCVar3[i].affinity,&local_30,in_R9);
    }
    if (local_30 != (Mem *)0x0) {
      db = v->db;
      if (db->mallocFailed == '\0') {
        pOVar5 = v->aOp;
        iVar2 = v->nOp;
        pOVar5[(long)iVar2 + -1].p4type = -10;
        pOVar5[(long)iVar2 + -1].p4.pMem = local_30;
      }
      else if (db->pnBytesFreed == (int *)0x0) {
        sqlite3ValueFree(local_30);
      }
      else {
        freeP4Mem(db,local_30);
      }
    }
  }
  if ((pCVar3[i].affinity == 'E') && (pTab->eTabType != '\x01')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      sqlite3VdbeAddOp3(v,0x57,iReg,0,0);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  Column *pCol;
  assert( pTab!=0 );
  assert( pTab->nCol>i );
  pCol = &pTab->aCol[i];
  if( pCol->iDflt ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    assert( !IsView(pTab) );
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zCnName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v),
                         sqlite3ColumnExpr(pTab,pCol), enc,
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pCol->affinity==SQLITE_AFF_REAL && !IsVirtual(pTab) ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}